

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab11.c
# Opt level: O2

int FeedFromArray(void)

{
  int iVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  stream.In = (FILE *)fopen("in.txt","w+");
  if ((FILE *)stream.In == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
    iVar1 = -1;
  }
  else {
    fprintf((FILE *)stream.In,"%lu %d\n",TestData.Tests[currentTest].CountItems,
            (ulong)(uint)TestData.Tests[currentTest].MaxKnapsackWeight);
    lVar3 = 0x10313c;
    uVar2 = 0;
    while( true ) {
      if (TestData.Tests[currentTest].CountItems <= uVar2) break;
      fprintf((FILE *)stream.In,"%d %d\n",(ulong)*(uint *)(lVar3 + -4 + currentTest * 0x478),
              (ulong)*(uint *)(lVar3 + currentTest * 0x478));
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 8;
    }
    fclose((FILE *)stream.In);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int FeedFromArray(void) {
    stream.In = fopen("in.txt", "w+");
    if (!stream.In) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(stream.In, "%lu %d\n", TestData.Tests[currentTest].CountItems, TestData.Tests[currentTest].MaxKnapsackWeight);
    for (size_t i = 0; i < TestData.Tests[currentTest].CountItems; ++i) {
        fprintf(stream.In, "%d %d\n", TestData.Tests[currentTest].Items[i].Weight, TestData.Tests[currentTest].Items[i].Cost);
    }
    fclose(stream.In);
    return 0;
}